

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O2

void __thiscall ThreadTask::~ThreadTask(ThreadTask *this)

{
  std::condition_variable::notify_all();
  std::thread::join();
  std::condition_variable::~condition_variable(&this->_condition);
  std::deque<Task,_std::allocator<Task>_>::~deque(&(this->_taskQueue).c);
  std::thread::~thread(&this->_thread);
  return;
}

Assistant:

~ThreadTask()
	{
		this->_condition.notify_all();
		this->_thread.join();
	}